

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void luv_push_stats_table(lua_State *L,uv_stat_t *s)

{
  bool bVar1;
  char *s_00;
  
  bVar1 = false;
  lua_createtable(L,0,0x17);
  lua_pushinteger(L,s->st_dev);
  lua_setfield(L,-2,"dev");
  lua_pushinteger(L,s->st_mode);
  lua_setfield(L,-2,"mode");
  lua_pushinteger(L,s->st_nlink);
  lua_setfield(L,-2,"nlink");
  lua_pushinteger(L,s->st_uid);
  lua_setfield(L,-2,"uid");
  lua_pushinteger(L,s->st_gid);
  lua_setfield(L,-2,"gid");
  lua_pushinteger(L,s->st_rdev);
  lua_setfield(L,-2,"rdev");
  lua_pushinteger(L,s->st_ino);
  lua_setfield(L,-2,"ino");
  lua_pushinteger(L,s->st_size);
  lua_setfield(L,-2,"size");
  lua_pushinteger(L,s->st_blksize);
  lua_setfield(L,-2,"blksize");
  lua_pushinteger(L,s->st_blocks);
  lua_setfield(L,-2,"blocks");
  lua_pushinteger(L,s->st_flags);
  lua_setfield(L,-2,"flags");
  lua_pushinteger(L,s->st_gen);
  lua_setfield(L,-2,"gen");
  luv_push_timespec_table(L,&s->st_atim);
  lua_setfield(L,-2,"atime");
  luv_push_timespec_table(L,&s->st_mtim);
  lua_setfield(L,-2,"mtime");
  luv_push_timespec_table(L,&s->st_ctim);
  lua_setfield(L,-2,"ctime");
  luv_push_timespec_table(L,&s->st_birthtim);
  lua_setfield(L,-2,"birthtime");
  switch((ulong)((uint)s->st_mode & 0xf000) - 0x1000 >> 0xc) {
  case 0:
    s_00 = "fifo";
    break;
  case 1:
    s_00 = "char";
    break;
  default:
    bVar1 = true;
    s_00 = (char *)0x0;
    goto LAB_00145e87;
  case 3:
    s_00 = "directory";
    break;
  case 5:
    s_00 = "block";
    break;
  case 7:
    s_00 = "file";
    goto LAB_00145e87;
  case 9:
    s_00 = "link";
    break;
  case 0xb:
    s_00 = "socket";
  }
  bVar1 = false;
LAB_00145e87:
  if (bVar1) {
    return;
  }
  lua_pushstring(L,s_00);
  lua_setfield(L,-2,"type");
  return;
}

Assistant:

static void luv_push_stats_table(lua_State* L, const uv_stat_t* s) {
  const char* type = NULL;
  lua_createtable(L, 0, 23);
  lua_pushinteger(L, s->st_dev);
  lua_setfield(L, -2, "dev");
  lua_pushinteger(L, s->st_mode);
  lua_setfield(L, -2, "mode");
  lua_pushinteger(L, s->st_nlink);
  lua_setfield(L, -2, "nlink");
  lua_pushinteger(L, s->st_uid);
  lua_setfield(L, -2, "uid");
  lua_pushinteger(L, s->st_gid);
  lua_setfield(L, -2, "gid");
  lua_pushinteger(L, s->st_rdev);
  lua_setfield(L, -2, "rdev");
  lua_pushinteger(L, s->st_ino);
  lua_setfield(L, -2, "ino");
  lua_pushinteger(L, s->st_size);
  lua_setfield(L, -2, "size");
  lua_pushinteger(L, s->st_blksize);
  lua_setfield(L, -2, "blksize");
  lua_pushinteger(L, s->st_blocks);
  lua_setfield(L, -2, "blocks");
  lua_pushinteger(L, s->st_flags);
  lua_setfield(L, -2, "flags");
  lua_pushinteger(L, s->st_gen);
  lua_setfield(L, -2, "gen");
  luv_push_timespec_table(L, &s->st_atim);
  lua_setfield(L, -2, "atime");
  luv_push_timespec_table(L, &s->st_mtim);
  lua_setfield(L, -2, "mtime");
  luv_push_timespec_table(L, &s->st_ctim);
  lua_setfield(L, -2, "ctime");
  luv_push_timespec_table(L, &s->st_birthtim);
  lua_setfield(L, -2, "birthtime");
  if (S_ISREG(s->st_mode)) {
    type = "file";
  }
  else if (S_ISDIR(s->st_mode)) {
    type = "directory";
  }
  else if (S_ISLNK(s->st_mode)) {
    type = "link";
  }
  else if (S_ISFIFO(s->st_mode)) {
    type = "fifo";
  }
#ifdef S_ISSOCK
  else if (S_ISSOCK(s->st_mode)) {
    type = "socket";
  }
#endif
  else if (S_ISCHR(s->st_mode)) {
    type = "char";
  }
  else if (S_ISBLK(s->st_mode)) {
    type = "block";
  }
  if (type) {
    lua_pushstring(L, type);
    lua_setfield(L, -2, "type");
  }
}